

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall LinearScan::AllocateNewLifetimes(LinearScan *this,Instr *instr)

{
  uint uVar1;
  anon_union_8_3_6c1fdb8e_for_scratch aVar2;
  Lifetime *newLifetime_00;
  bool bVar3;
  RegNum RVar4;
  bool bVar5;
  uint32 uVar6;
  uint32 uVar7;
  Opnd *pOVar8;
  RegOpnd *pRVar9;
  RegOpnd *pRVar10;
  Type *ppLVar11;
  bool local_62;
  RegNum local_39;
  RegNum reg;
  Lifetime *newLifetime;
  Lifetime *dstLifetime;
  StackSym *srcSym;
  RegOpnd *src;
  Instr *instr_local;
  LinearScan *this_local;
  
  bVar3 = SkipNumberedInstr(this,instr);
  if (bVar3) {
    return;
  }
  pOVar8 = IR::Instr::GetSrc1(instr);
  if (pOVar8 != (Opnd *)0x0) {
    pOVar8 = IR::Instr::GetSrc1(instr);
    bVar3 = IR::Opnd::IsRegOpnd(pOVar8);
    if (((bVar3) && (bVar3 = LowererMD::IsAssign(instr), bVar3)) &&
       (pOVar8 = IR::Instr::GetDst(instr), pOVar8 != (Opnd *)0x0)) {
      pOVar8 = IR::Instr::GetDst(instr);
      bVar3 = IR::Opnd::IsRegOpnd(pOVar8);
      if (bVar3) {
        pOVar8 = IR::Instr::GetDst(instr);
        pRVar9 = IR::Opnd::AsRegOpnd(pOVar8);
        if (pRVar9->m_sym != (StackSym *)0x0) {
          pOVar8 = IR::Instr::GetSrc1(instr);
          pRVar9 = IR::Opnd::AsRegOpnd(pOVar8);
          if ((pRVar9->m_sym == (StackSym *)0x0) ||
             (uVar7 = *(uint32 *)((long)pRVar9->m_sym->scratch + 0x7c),
             uVar6 = IR::Instr::GetNumber(instr), uVar7 == uVar6)) {
            pOVar8 = IR::Instr::GetDst(instr);
            pRVar10 = IR::Opnd::AsRegOpnd(pOVar8);
            aVar2 = pRVar10->m_sym->scratch;
            if (aVar2 != (anon_union_8_3_6c1fdb8e_for_scratch)0x0) {
              RVar4 = IR::RegOpnd::GetReg(pRVar9);
              BVUnitT<unsigned_long>::Set
                        ((BVUnitT<unsigned_long> *)((long)aVar2 + 0x70),(uint)RVar4);
            }
          }
        }
      }
    }
  }
  do {
    while( true ) {
      while( true ) {
        bVar5 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Empty
                          (&this->lifetimeList->
                            super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
        bVar3 = false;
        if (!bVar5) {
          ppLVar11 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Head
                               (&this->lifetimeList->
                                 super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
          uVar1 = (*ppLVar11)->start;
          uVar7 = IR::Instr::GetNumber(instr);
          bVar3 = uVar1 <= uVar7;
        }
        if (!bVar3) {
          return;
        }
        ppLVar11 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&this->lifetimeList->
                               super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
        newLifetime_00 = *ppLVar11;
        uVar7 = IR::Instr::GetNumber(instr);
        newLifetime_00->lastAllocationStart = uVar7;
        SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead(this->lifetimeList);
        if ((*(ushort *)&newLifetime_00->field_0x9c & 0x100) == 0) break;
        SpillLiveRange(this,newLifetime_00,(Instr *)0x0);
      }
      if (newLifetime_00->reg == RegNOREG) break;
      local_39 = newLifetime_00->reg;
      bVar3 = IsInHelperBlock(this);
      if (bVar3) {
        uVar1 = newLifetime_00->end;
        uVar7 = IR::Instr::GetNumber(this->currentOpHelperBlock->opHelperEndInstr);
        local_62 = uVar7 < uVar1;
      }
      else {
        local_62 = false;
      }
      SpillReg(this,local_39,local_62);
      *(ushort *)&newLifetime_00->field_0x9c =
           *(ushort *)&newLifetime_00->field_0x9c & 0xff7f | 0x80;
LAB_00763af2:
      if ((*(ushort *)&newLifetime_00->field_0x9c & 1) == 0) {
        AssignActiveReg(this,newLifetime_00,local_39);
      }
    }
    if ((*(ushort *)&newLifetime_00->field_0x9c >> 3 & 1) == 0) {
      local_39 = FindReg(this,newLifetime_00,(RegOpnd *)0x0,false);
      goto LAB_00763af2;
    }
    *(ushort *)&newLifetime_00->field_0x9c = *(ushort *)&newLifetime_00->field_0x9c & 0xfffe | 1;
  } while( true );
}

Assistant:

void
LinearScan::AllocateNewLifetimes(IR::Instr *instr)
{
    if (this->SkipNumberedInstr(instr))
    {
        return;
    }

    // Try to catch:
    //      x = MOV y(r1)
    // where y's lifetime just ended and x's lifetime is starting.
    // If so, set r1 as a preferred register for x, which may allow peeps to remove the MOV
    if (instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd() && LowererMD::IsAssign(instr) && instr->GetDst() && instr->GetDst()->IsRegOpnd() && instr->GetDst()->AsRegOpnd()->m_sym)
    {
        IR::RegOpnd *src = instr->GetSrc1()->AsRegOpnd();
        StackSym *srcSym = src->m_sym;
        // If src is a physReg ref, or src's lifetime ends here.
        if (!srcSym || srcSym->scratch.linearScan.lifetime->end == instr->GetNumber())
        {
            Lifetime *dstLifetime = instr->GetDst()->AsRegOpnd()->m_sym->scratch.linearScan.lifetime;
            if (dstLifetime)
            {
                dstLifetime->regPreference.Set(src->GetReg());
            }
        }
    }

    // Look for starting lifetimes
    while (!this->lifetimeList->Empty() && this->lifetimeList->Head()->start <= instr->GetNumber())
    {
        // We're at the start of a new live range

        Lifetime * newLifetime = this->lifetimeList->Head();
        newLifetime->lastAllocationStart = instr->GetNumber();

        this->lifetimeList->RemoveHead();

        if (newLifetime->dontAllocate)
        {
            // Lifetime spilled before beginning allocation (e.g., a lifetime known to span
            // multiple EH regions.) Do the work of spilling it now without adding it to the list.
            this->SpillLiveRange(newLifetime);
            continue;
        }

        RegNum reg;
        if (newLifetime->reg == RegNOREG)
        {
            if (newLifetime->isDeadStore)
            {
                // No uses, let's not waste a reg.
                newLifetime->isSpilled = true;
                continue;
            }
            reg = this->FindReg(newLifetime, nullptr);
        }
        else
        {
            // This lifetime is already assigned a physical register.  Make
            // sure that register is available by calling SpillReg
            reg = newLifetime->reg;

            // If we're in a helper block, the physical register we're trying to ensure is available might get helper
            // spilled. Don't allow that if this lifetime's end lies beyond the end of the helper block because
            // spill code assumes that this physical register isn't active at the end of the helper block when it tries
            // to restore it. So we'd have to really spill the lifetime then anyway.
            this->SpillReg(reg, IsInHelperBlock() ? (newLifetime->end > currentOpHelperBlock->opHelperEndInstr->GetNumber()) : false);
            newLifetime->cantSpill = true;
        }

        // If we did get a register for this lifetime, add it to the active set.
        if (newLifetime->isSpilled == false)
        {
            this->AssignActiveReg(newLifetime, reg);
        }
    }
}